

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmlmain.c
# Opt level: O3

ebml_element *
EBML_FindNextElement
          (stream *Input,ebml_parser_context *pContext,int *UpperLevels,bool_t AllowDummyElt)

{
  bool bVar1;
  long lVar2;
  filepos_t fVar3;
  ebml_element *Element;
  bool_t bVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  ebml_parser_context *peVar8;
  ebml_parser_context *peVar9;
  bool_t bVar10;
  char cVar11;
  undefined8 in_R9;
  ulong uVar12;
  ebml_parser_context *peVar13;
  byte bVar14;
  byte bVar15;
  uint8_t *InBuffer;
  bool bVar16;
  int LevelChange;
  uint8_t PossibleIdNSize [16];
  filepos_t SizeUnknown;
  ebml_parser_context OrigContext;
  int local_e4;
  stream *local_e0;
  long local_d8;
  ulong local_d0;
  ebml_parser_context *local_c8;
  ebml_parser_context *local_c0;
  uint8_t local_b8 [16];
  ulong local_a8;
  long local_a0;
  long local_98;
  ebml_element *local_90;
  int *local_88;
  long local_80;
  int local_74;
  bool_t local_70;
  ebml_parser_context *local_68;
  ulong local_60;
  ebml_parser_context local_58;
  
  local_70 = AllowDummyElt;
  local_68 = pContext;
  if (Input == (stream *)0x0) {
    __assert_fail("(const void*)(Input)!=NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmain.c"
                  ,0x1e2,
                  "ebml_element *EBML_FindNextElement(struct stream *, const ebml_parser_context *, int *, bool_t)"
                 );
  }
  local_74 = *UpperLevels;
  local_98 = (**(code **)((long)(Input->Base).VMT + 0x78))(Input,0,1);
  if (local_98 == -1) {
    return (ebml_element *)0x0;
  }
  local_58.EndPosition = local_68->EndPosition;
  local_58.Profile = local_68->Profile;
  local_58._28_4_ = *(undefined4 *)&local_68->field_0x1c;
  local_58.Context = local_68->Context;
  local_58.UpContext = local_68->UpContext;
  peVar9 = &local_58;
  if ((local_58.EndPosition != -1) && (peVar9 = &local_58, local_58.EndPosition <= local_98)) {
    peVar9 = &local_58;
    while (peVar13 = peVar9->UpContext, peVar13 != (ebml_parser_context *)0x0) {
      *UpperLevels = *UpperLevels + 1;
      peVar9 = peVar13;
      if ((peVar13->EndPosition == -1) || (local_98 < peVar13->EndPosition)) break;
    }
  }
  local_88 = UpperLevels;
  local_90 = (ebml_element *)0x0;
  local_d0 = 0;
  bVar15 = 0;
  uVar12 = 0;
  local_e0 = Input;
  peVar13 = peVar9;
  do {
    while( true ) {
      local_c8 = peVar13;
      if ('\0' < (char)bVar15) {
        bVar14 = bVar15 - 1;
        if (2 < (byte)(bVar15 - 1)) {
          bVar14 = 3;
        }
        uVar7 = 0;
        do {
          if ((char)(local_b8[0] << ((byte)uVar7 & 0x1f)) < '\0') {
            local_d0 = CONCAT71((int7)(uVar7 >> 8),(byte)uVar7 + 1);
            goto LAB_0011564a;
          }
          uVar6 = (int)uVar7 + 1;
          uVar7 = (ulong)uVar6;
        } while ((byte)(bVar14 + 1) != uVar6);
      }
      if (peVar9->EndPosition == uVar12 + local_98) break;
      bVar14 = bVar15;
      if ('\x03' < (char)bVar15) {
        bVar14 = bVar15 - 1;
        memmove(local_b8,local_b8 + 1,(ulong)bVar14);
      }
      lVar2 = (**(code **)((long)(Input->Base).VMT + 0x60))(Input,local_b8 + (char)bVar14,1,0);
      if (lVar2 != 0) {
        return local_90;
      }
      bVar15 = bVar14 + 1;
      uVar12 = (ulong)((int)uVar12 + 1);
      peVar13 = local_c8;
      if ('\x0e' < (char)bVar14) goto LAB_00115a44;
    }
LAB_0011564a:
    cVar11 = bVar15 - (char)local_d0;
    local_a8 = local_d0 & 0xff;
    InBuffer = local_b8 + local_a8;
    peVar9 = (ebml_parser_context *)(long)cVar11;
    local_c0 = peVar9;
    fVar3 = EBML_ReadCodedSizeValue(InBuffer,(size_t *)&local_c0,&local_80);
    bVar16 = local_c0 != (ebml_parser_context *)0x0;
    if ((!bVar16) && (cVar11 < '\b')) {
      do {
        peVar13 = local_c8;
        Input = local_e0;
        if (((0 < (long)peVar9) && (*InBuffer == '\0')) ||
           (local_c8->EndPosition == uVar12 + local_98)) {
          lVar2 = (**(code **)((long)(local_e0->Base).VMT + 0x78))(local_e0,0,1);
          bVar10 = local_70;
          bVar14 = bVar15;
          goto LAB_001159b6;
        }
        lVar2 = (**(code **)((long)(local_e0->Base).VMT + 0x60))
                          (local_e0,local_b8 + (char)bVar15,1,0);
        if (lVar2 != 0) {
          return local_90;
        }
        bVar15 = bVar15 + 1;
        uVar12 = (ulong)((int)uVar12 + 1);
        peVar13 = (ebml_parser_context *)((long)&peVar9->Context + 1);
        local_c0 = peVar13;
        fVar3 = EBML_ReadCodedSizeValue(InBuffer,(size_t *)&local_c0,&local_80);
        bVar16 = local_c0 != (ebml_parser_context *)0x0;
      } while ((!bVar16) && (bVar1 = (long)peVar9 < 7, peVar9 = peVar13, bVar1));
    }
    Input = local_e0;
    local_a0 = fVar3;
    lVar2 = (**(code **)((long)(local_e0->Base).VMT + 0x78))(local_e0,0,1);
    bVar10 = local_70;
    peVar13 = local_c8;
    bVar14 = bVar15;
    if (bVar16) {
      peVar9 = local_c8;
      local_d8 = lVar2;
      if ((local_a0 == local_80) || (lVar5 = local_c8->EndPosition, lVar5 == -1)) {
LAB_00115837:
        local_e4 = 0;
        in_R9 = 0;
        Element = EBML_ElementCreateUsingContext
                            (Input,local_b8,(int8_t)local_d0,peVar9,&local_e4,0,local_70);
        peVar13 = peVar9;
        lVar2 = local_d8;
        if (Element != (ebml_element *)0x0) {
          if (bVar10 == 0) goto LAB_00115870;
LAB_00115881:
          lVar2 = local_80;
          if ((ebml_parser_context *)0x8 < local_c0) {
            __assert_fail("_SizeLength <= 8",
                          "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmain.c"
                          ,0x24e,
                          "ebml_element *EBML_FindNextElement(struct stream *, const ebml_parser_context *, int *, bool_t)"
                         );
          }
          Element->SizeLength = (int8_t)local_c0;
          Element->DataSize = local_a0;
          local_c8 = local_c0;
          if (local_a0 == local_80) {
            fVar3 = peVar9->EndPosition;
          }
          else {
            fVar3 = (local_a8 - (long)(char)bVar15) + local_d8 + local_a0 + (long)local_c0;
          }
          local_60 = (ulong)(local_a0 == local_80);
          Element->EndPosition = fVar3;
          EBML_ElementSetInfiniteSize(Element,local_60);
          if (((bVar10 != 0) &&
              (lVar5 = (**(code **)((long)(Element->Base).Base.VMT + 0x70))(Element), lVar5 == 0))
             && (bVar4 = EBML_ElementIsDummy(Element), bVar4 == 0)) {
            NodeDelete((node *)Element);
            Element = CreateElement(local_e0,local_b8,(int8_t)local_d0,&EBML_ContextDummy,
                                    (ebml_master *)0xffffffff,(int)in_R9);
            Element->SizeLength = (int8_t)local_c8;
            Element->DataSize = local_a0;
            if (local_a0 == lVar2) {
              fVar3 = peVar9->EndPosition;
            }
            else {
              fVar3 = (local_a8 - (long)(char)bVar15) + local_d8 + local_a0 + (long)local_c8;
            }
            Element->EndPosition = fVar3;
            EBML_ElementSetInfiniteSize(Element,local_60);
          }
          lVar5 = (**(code **)((long)(Element->Base).Base.VMT + 0x70))(Element);
          Input = local_e0;
          if (lVar5 != 0) {
            if (local_a0 == lVar2) {
              Element->DataSize = -1;
            }
            if (0 < local_e4) {
              *local_88 = *local_88 + local_e4;
            }
            lVar2 = local_a8 + (local_d8 - (char)bVar15);
            Element->SizePosition = lVar2;
            Element->ElementPosition = local_d8 - (char)bVar15;
            (**(code **)((long)(local_e0->Base).VMT + 0x78))(local_e0,(long)local_c8 + lVar2,0);
            return Element;
          }
LAB_001159a6:
          NodeDelete((node *)Element);
          peVar13 = peVar9;
          lVar2 = local_d8;
        }
      }
      else {
        peVar8 = local_c8;
        do {
          peVar9 = peVar8;
          if ((local_a0 - (char)bVar15) + lVar2 <= lVar5) goto LAB_00115837;
          peVar13 = local_c8;
          if ((local_70 != 0) ||
             (peVar9 = peVar8->UpContext, peVar13 = peVar8, peVar9 == (ebml_parser_context *)0x0))
          goto LAB_001159b6;
          *local_88 = *local_88 + 1;
          lVar5 = peVar9->EndPosition;
          peVar8 = peVar9;
        } while (lVar5 != -1);
        local_e4 = 0;
        in_R9 = 0;
        Element = EBML_ElementCreateUsingContext
                            (Input,local_b8,(int8_t)local_d0,peVar9,&local_e4,0,0);
        peVar13 = peVar9;
        lVar2 = local_d8;
        if (Element != (ebml_element *)0x0) {
LAB_00115870:
          bVar4 = EBML_ElementIsDummy(Element);
          if (bVar4 == 0) goto LAB_00115881;
          goto LAB_001159a6;
        }
      }
    }
LAB_001159b6:
    lVar5 = peVar13->EndPosition;
    if ((lVar5 != -1) && (lVar5 <= lVar2)) {
      if ((bVar10 != 0) && (lVar5 != lVar2)) {
        local_90 = CreateElement(Input,local_b8,(int8_t)local_d0,&EBML_ContextDummy,
                                 (ebml_master *)0xffffffff,(int)in_R9);
        if (local_90 != (ebml_element *)0x0) {
          lVar5 = local_a8 + (lVar2 - (char)bVar14);
          local_90->SizePosition = lVar5;
          local_90->ElementPosition = lVar2 - (char)bVar14;
          local_90->DataSize = 0;
          fVar3 = peVar13->EndPosition;
          local_90->SizeLength = (char)fVar3 - (char)lVar5;
          local_90->EndPosition = fVar3;
          (**(code **)((long)(Input->Base).VMT + 0x78))(Input,fVar3,0);
          return local_90;
        }
      }
      return (ebml_element *)0x0;
    }
    bVar15 = bVar14 - 1;
    memmove(local_b8,local_b8 + 1,(long)(char)bVar15);
    *local_88 = local_74;
    local_58.EndPosition = local_68->EndPosition;
    local_58.Profile = local_68->Profile;
    local_58._28_4_ = *(undefined4 *)&local_68->field_0x1c;
    local_58.Context = local_68->Context;
    local_58.UpContext = local_68->UpContext;
    if ((local_58.EndPosition != -1) &&
       (local_58.EndPosition <= (long)((local_a8 - (long)(char)bVar14) + lVar2))) {
      return (ebml_element *)0x0;
    }
    peVar9 = &local_58;
    peVar13 = peVar9;
  } while ((char)bVar15 < '\x10');
LAB_00115a44:
  __assert_fail("ReadIndex < 16",
                "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmain.c"
                ,0x1fc,
                "ebml_element *EBML_FindNextElement(struct stream *, const ebml_parser_context *, int *, bool_t)"
               );
}

Assistant:

ebml_element *EBML_FindNextElement(struct stream *Input, const ebml_parser_context *pContext, int *UpperLevels, bool_t AllowDummyElt)
{
    uint8_t PossibleID_Length = 0;
    uint8_t PossibleIdNSize[16];
    int PossibleSizeLength;
    filepos_t SizeUnknown;
    int8_t SizeIdx,ReadIndex = 0; // trick for the algo, start index at 0
    uint32_t ReadSize = 0;
    filepos_t SizeFound;
    bool_t bFound;
    int UpperLevel_original = *UpperLevels;
    filepos_t CurrentPos;
    filepos_t StartPos = Stream_Seek(Input,0,SEEK_CUR);
    ebml_parser_context OrigContext;
    const ebml_parser_context *Context = &OrigContext;

    if (StartPos == INVALID_FILEPOS_T)
        return NULL;

    assert(Context != NULL);
    OrigContext = *pContext;

    // adjust the Context to allow the StartPos to make sense
    while (Context && Context->EndPosition != INVALID_FILEPOS_T && (StartPos >= Context->EndPosition))
    {
        if (Context->UpContext==NULL)
            break;
        Context = Context->UpContext;
        (*UpperLevels)++;
    }

    do {
        size_t _SizeLength;

        // read a potential ID
        do {
            uint8_t IdBitMask = 1 << 7;

            assert(ReadIndex < 16);
            // build the ID with the current Read Buffer
            bFound = 0;
            for (SizeIdx = 0; SizeIdx < ReadIndex && SizeIdx < 4; SizeIdx++) {
                if (PossibleIdNSize[0] & (IdBitMask >> SizeIdx)) {
                    // ID found
                    PossibleID_Length = SizeIdx + 1;
                    IdBitMask >>= SizeIdx;
                    bFound = 1;
                    break;
                }
            }
            if (bFound)
                break;
            if (Context->EndPosition == StartPos+ReadSize)
                break; // we should not read further than our limit

            if (ReadIndex >= 4) {
                // ID not found
                // shift left the read octets
                memmove(&PossibleIdNSize[0],&PossibleIdNSize[1], --ReadIndex);
            }

            if (Stream_ReadOneOrMore(Input,&PossibleIdNSize[ReadIndex++], 1, NULL)!=ERR_NONE)
                return NULL; // no more data ?
            ReadSize++;

        } while (!bFound);

        SizeIdx = ReadIndex;
        ReadIndex = ReadIndex - PossibleID_Length;

        // read the data size
        PossibleSizeLength = ReadIndex;
        bFound = 0;
        while (1)
        {
            _SizeLength = PossibleSizeLength;
            SizeFound = EBML_ReadCodedSizeValue(&PossibleIdNSize[PossibleID_Length], &_SizeLength, &SizeUnknown);
            if (_SizeLength != 0) {
                bFound = 1;
                break;
            }
            if (PossibleSizeLength >= 8)
                break;
            if (PossibleSizeLength > 0 && PossibleIdNSize[PossibleID_Length] == 0)
                break; // invalid all zero size
            if (Context->EndPosition == StartPos+ReadSize)
                break; // we should not read further than our limit
            if (Stream_ReadOneOrMore(Input,&PossibleIdNSize[SizeIdx++], 1, NULL)!=ERR_NONE)
                return NULL;
            ReadSize++;
            PossibleSizeLength++;
        }

        CurrentPos = Stream_Seek(Input,0,SEEK_CUR);
        if (bFound)
        {
            // make sure the element we found is contained in the Context
            if (SizeFound != SizeUnknown)
            {
                while (Context && Context->EndPosition != INVALID_FILEPOS_T && (CurrentPos + SizeFound - SizeIdx > Context->EndPosition))
                {
                    if (AllowDummyElt || Context->UpContext==NULL)
                    {
                        bFound = 0;
                        break;
                    }
                    Context = Context->UpContext;
                    (*UpperLevels)++;
                }
            }
        }

        if (bFound)
        {
            // find the element in the context and use the correct creator
            int LevelChange = 0;
            ebml_element *Result = EBML_ElementCreateUsingContext(Input, PossibleIdNSize, PossibleID_Length, Context, &LevelChange, 0, AllowDummyElt);
            if (Result != NULL)
            {
                if (AllowDummyElt || !EBML_ElementIsDummy(Result)) {
                    assert(_SizeLength <= 8);
                    Result->SizeLength = (int8_t)_SizeLength;
                    Result->DataSize = SizeFound;
                    Result->EndPosition = (SizeFound == SizeUnknown) ? Context->EndPosition : (filepos_t)(CurrentPos - SizeIdx + PossibleID_Length + _SizeLength + SizeFound);
                    EBML_ElementSetInfiniteSize(Result, SizeFound == SizeUnknown);

                    if (AllowDummyElt && !EBML_ElementValidateSize(Result) && !EBML_ElementIsDummy(Result))
                    {
                        // the element has a good ID but wrong size, so replace with a dummy
                        NodeDelete((node*)Result);
                        Result = CreateElement(Input, PossibleIdNSize, PossibleID_Length, &EBML_ContextDummy, NULL, EBML_ANY_PROFILE);
                        Result->SizeLength = (int8_t)_SizeLength;
                        Result->DataSize = SizeFound;
                        Result->EndPosition = (SizeFound == SizeUnknown) ? Context->EndPosition : (filepos_t)(CurrentPos - SizeIdx + PossibleID_Length + _SizeLength + SizeFound);
                        EBML_ElementSetInfiniteSize(Result, SizeFound == SizeUnknown);
                    }

                    // LevelChange values
                    // -1 : global element
                    //  0 : child
                    //  1 : same level
                    //  + : further parent
                    if (EBML_ElementValidateSize(Result))
                    {
                        if (SizeFound == SizeUnknown)
                        {
                            Result->DataSize = INVALID_FILEPOS_T;
                        }

                        if (LevelChange > 0)
                            *UpperLevels += LevelChange;
                        Result->SizePosition = CurrentPos - SizeIdx + PossibleID_Length;
                        Result->ElementPosition = Result->SizePosition - PossibleID_Length;
                        // place the file at the beggining of the data
                        Stream_Seek(Input,Result->SizePosition + _SizeLength,SEEK_SET);
                        return Result;
                    }
                }
                NodeDelete((node*)Result);
            }
        }

        if (Context->EndPosition!=INVALID_FILEPOS_T && Context->EndPosition <= CurrentPos)
        {
            if (AllowDummyElt && Context->EndPosition != CurrentPos)
            {
                /* add a dummy placeholder for the remaining of the parent */
                int LevelChange = 0;
                ebml_element *Result = CreateElement(Input, PossibleIdNSize, PossibleID_Length, &EBML_ContextDummy, NULL, EBML_ANY_PROFILE);
                if (Result != NULL)
                {
                    if (LevelChange > 0)
                        *UpperLevels += LevelChange;
                    Result->SizePosition = CurrentPos - SizeIdx + PossibleID_Length;
                    Result->ElementPosition = Result->SizePosition - PossibleID_Length;
                    Result->DataSize = 0;
                    Result->SizeLength = (int8_t)(Context->EndPosition - Result->SizePosition);
                    Result->EndPosition = Context->EndPosition;
                    // place the file at the end of the element
                    Stream_Seek(Input,Context->EndPosition,SEEK_SET);
                    return Result;
                }
            }
            break; // we should not read further than our limit
        }

        // recover all the data in the buffer minus one byte
        ReadIndex = SizeIdx - 1;
        memmove(&PossibleIdNSize[0], &PossibleIdNSize[1], ReadIndex);
        *UpperLevels = UpperLevel_original;
        OrigContext = *pContext;
        Context = &OrigContext;
    } while (Context->EndPosition==INVALID_FILEPOS_T || (Context->EndPosition > CurrentPos - SizeIdx + PossibleID_Length));

    return NULL;
}